

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

APInt __thiscall llvm::APIntOps::RoundingSDiv(APIntOps *this,APInt *A,APInt *B,Rounding RM)

{
  bool bVar1;
  bool bVar2;
  undefined8 extraout_RDX;
  APInt *this_00;
  APInt AVar4;
  APInt Quo;
  APInt Rem;
  APInt local_40;
  APInt local_30;
  undefined8 uVar3;
  
  if (RM != UP) {
    if (RM == TOWARD_ZERO) {
      AVar4 = APInt::sdiv((APInt *)this,A);
      uVar3 = AVar4._8_8_;
      goto LAB_0016f67d;
    }
    if (RM != DOWN) {
      llvm_unreachable_internal
                ("Unknown APInt::Rounding enum",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                 ,0xa94);
    }
  }
  Quo.BitWidth = 1;
  Quo.U.VAL = 0;
  Rem.U.VAL = 0;
  Rem.BitWidth = Quo.BitWidth;
  APInt::sdivrem(A,B,&Quo,&Rem);
  bVar1 = APInt::operator==(&Rem,0);
  if (bVar1) {
LAB_0016f655:
    *(uint *)(this + 8) = Quo.BitWidth;
    *(anon_union_8_2_1313ab2f_for_U *)this = Quo.U;
    Quo.BitWidth = 0;
  }
  else {
    bVar1 = APInt::isNegative(&Rem);
    bVar2 = APInt::isNegative(B);
    if (RM == DOWN) {
      if (bVar2 == bVar1) goto LAB_0016f655;
      this_00 = &local_30;
      APInt::APInt(this_00,&Quo);
      operator-((llvm *)this,this_00,1);
    }
    else {
      if (bVar2 != bVar1) goto LAB_0016f655;
      this_00 = &local_40;
      APInt::APInt(this_00,&Quo);
      operator+((llvm *)this,this_00,1);
    }
    APInt::~APInt(this_00);
  }
  APInt::~APInt(&Rem);
  APInt::~APInt(&Quo);
  uVar3 = extraout_RDX;
LAB_0016f67d:
  AVar4._8_8_ = uVar3;
  AVar4.U.pVal = (uint64_t *)this;
  return AVar4;
}

Assistant:

APInt llvm::APIntOps::RoundingSDiv(const APInt &A, const APInt &B,
                                   APInt::Rounding RM) {
  switch (RM) {
  case APInt::Rounding::DOWN:
  case APInt::Rounding::UP: {
    APInt Quo, Rem;
    APInt::sdivrem(A, B, Quo, Rem);
    if (Rem == 0)
      return Quo;
    // This algorithm deals with arbitrary rounding mode used by sdivrem.
    // We want to check whether the non-integer part of the mathematical value
    // is negative or not. If the non-integer part is negative, we need to round
    // down from Quo; otherwise, if it's positive or 0, we return Quo, as it's
    // already rounded down.
    if (RM == APInt::Rounding::DOWN) {
      if (Rem.isNegative() != B.isNegative())
        return Quo - 1;
      return Quo;
    }
    if (Rem.isNegative() != B.isNegative())
      return Quo;
    return Quo + 1;
  }
  // Currently sdiv rounds twards zero.
  case APInt::Rounding::TOWARD_ZERO:
    return A.sdiv(B);
  }
  llvm_unreachable("Unknown APInt::Rounding enum");
}